

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlNodePtr
xmlCtxtParseContent(xmlParserCtxtPtr ctxt,xmlParserInputPtr input,xmlNodePtr node,int hasTextDecl)

{
  xmlElementType xVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _xmlDoc *p_Var5;
  xmlDictPtr pxVar6;
  int iVar7;
  bool bVar8;
  xmlHashedString xVar9;
  undefined4 uStack_a4;
  undefined4 uStack_94;
  undefined1 local_88 [8];
  xmlHashedString huri;
  xmlHashedString hprefix;
  xmlNsPtr ns;
  int oldLoadSubset;
  int oldDictNames;
  int oldOptions;
  xmlDictPtr oldDict;
  xmlNodePtr pxStack_40;
  int nsnr;
  xmlNodePtr list;
  xmlNodePtr cur;
  xmlDocPtr doc;
  xmlNodePtr pxStack_20;
  int hasTextDecl_local;
  xmlNodePtr node_local;
  xmlParserInputPtr input_local;
  xmlParserCtxtPtr ctxt_local;
  
  pxStack_40 = (xmlNodePtr)0x0;
  oldDict._4_4_ = 0;
  if (((ctxt == (xmlParserCtxtPtr)0x0) || (input == (xmlParserInputPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
  }
  else {
    p_Var5 = node->doc;
    if (p_Var5 == (_xmlDoc *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
    }
    else {
      xVar1 = node->type;
      pxStack_20 = node;
      if (xVar1 != XML_ELEMENT_NODE) {
        if ((xVar1 - XML_ATTRIBUTE_NODE < 4) || (xVar1 - XML_PI_NODE < 2)) {
          list = node->parent;
          while (list != (xmlNodePtr)0x0) {
            if (((list->type == XML_ELEMENT_NODE) || (list->type == XML_DOCUMENT_NODE)) ||
               (list->type == XML_HTML_DOCUMENT_NODE)) {
              pxStack_20 = list;
              break;
            }
            list = node->parent;
          }
        }
        else if ((xVar1 != XML_DOCUMENT_NODE) && (xVar1 != XML_HTML_DOCUMENT_NODE)) {
          xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
          goto LAB_0014b8b2;
        }
      }
      if (ctxt->html == 0) {
        xmlCtxtReset(ctxt);
      }
      else {
        htmlCtxtReset(ctxt);
      }
      pxVar6 = ctxt->dict;
      iVar2 = ctxt->options;
      iVar3 = ctxt->dictNames;
      iVar4 = ctxt->loadsubset;
      if (p_Var5->dict == (_xmlDict *)0x0) {
        ctxt->options = ctxt->options | 0x1000;
        ctxt->dictNames = 0;
      }
      else {
        ctxt->dict = p_Var5->dict;
      }
      ctxt->loadsubset = ctxt->loadsubset | 8;
      ctxt->myDoc = p_Var5;
      if (ctxt->html == 0) {
        xmlCtxtInitializeLate(ctxt);
        list = pxStack_20;
        while( true ) {
          bVar8 = false;
          if (list != (xmlNodePtr)0x0) {
            bVar8 = list->type == XML_ELEMENT_NODE;
          }
          if (!bVar8) break;
          for (hprefix.name = (xmlChar *)list->nsDef; hprefix.name != (xmlChar *)0x0;
              hprefix.name = *(xmlChar **)hprefix.name) {
            xVar9 = xmlDictLookupHashed(ctxt->dict,*(xmlChar **)(hprefix.name + 0x18),-1);
            huri.name = (xmlChar *)CONCAT44(uStack_94,xVar9.hashValue);
            xVar9 = xmlDictLookupHashed(ctxt->dict,*(xmlChar **)(hprefix.name + 0x10),-1);
            huri._0_8_ = xVar9.name;
            local_88._4_4_ = uStack_a4;
            local_88._0_4_ = xVar9.hashValue;
            iVar7 = xmlParserNsPush(ctxt,(xmlHashedString *)&huri.name,(xmlHashedString *)local_88,
                                    hprefix.name,1);
            if (0 < iVar7) {
              oldDict._4_4_ = oldDict._4_4_ + 1;
            }
          }
          list = list->parent;
        }
        pxStack_40 = xmlCtxtParseContentInternal(ctxt,input,hasTextDecl,1);
        if (0 < oldDict._4_4_) {
          xmlParserNsPop(ctxt,oldDict._4_4_);
        }
      }
      else {
        ctxt->options = ctxt->options | 0x2000;
        pxStack_40 = htmlCtxtParseContentInternal(ctxt,input);
      }
      ctxt->dict = pxVar6;
      ctxt->options = iVar2;
      ctxt->dictNames = iVar3;
      ctxt->loadsubset = iVar4;
      ctxt->myDoc = (xmlDocPtr)0x0;
      ctxt->node = (xmlNodePtr)0x0;
    }
  }
LAB_0014b8b2:
  xmlFreeInputStream(input);
  return pxStack_40;
}

Assistant:

xmlNodePtr
xmlCtxtParseContent(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                    xmlNodePtr node, int hasTextDecl) {
    xmlDocPtr doc;
    xmlNodePtr cur, list = NULL;
    int nsnr = 0;
    xmlDictPtr oldDict;
    int oldOptions, oldDictNames, oldLoadSubset;

    if ((ctxt == NULL) || (input == NULL) || (node == NULL)) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        goto exit;
    }

    doc = node->doc;
    if (doc == NULL) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        goto exit;
    }

    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            break;

        case XML_ATTRIBUTE_NODE:
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
            for (cur = node->parent; cur != NULL; cur = node->parent) {
                if ((cur->type == XML_ELEMENT_NODE) ||
                    (cur->type == XML_DOCUMENT_NODE) ||
                    (cur->type == XML_HTML_DOCUMENT_NODE)) {
                    node = cur;
                    break;
                }
            }
            break;

        default:
            xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
            goto exit;
    }

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html)
        htmlCtxtReset(ctxt);
    else
#endif
        xmlCtxtReset(ctxt);

    oldDict = ctxt->dict;
    oldOptions = ctxt->options;
    oldDictNames = ctxt->dictNames;
    oldLoadSubset = ctxt->loadsubset;

    /*
     * Use input doc's dict if present, else assure XML_PARSE_NODICT is set.
     */
    if (doc->dict != NULL) {
        ctxt->dict = doc->dict;
    } else {
        ctxt->options |= XML_PARSE_NODICT;
        ctxt->dictNames = 0;
    }

    /*
     * Disable IDs
     */
    ctxt->loadsubset |= XML_SKIP_IDS;

    ctxt->myDoc = doc;

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html) {
        /*
         * When parsing in context, it makes no sense to add implied
         * elements like html/body/etc...
         */
        ctxt->options |= HTML_PARSE_NOIMPLIED;

        list = htmlCtxtParseContentInternal(ctxt, input);
    } else
#endif
    {
        xmlCtxtInitializeLate(ctxt);

        /*
         * initialize the SAX2 namespaces stack
         */
        cur = node;
        while ((cur != NULL) && (cur->type == XML_ELEMENT_NODE)) {
            xmlNsPtr ns = cur->nsDef;
            xmlHashedString hprefix, huri;

            while (ns != NULL) {
                hprefix = xmlDictLookupHashed(ctxt->dict, ns->prefix, -1);
                huri = xmlDictLookupHashed(ctxt->dict, ns->href, -1);
                if (xmlParserNsPush(ctxt, &hprefix, &huri, ns, 1) > 0)
                    nsnr++;
                ns = ns->next;
            }
            cur = cur->parent;
        }

        list = xmlCtxtParseContentInternal(ctxt, input, hasTextDecl, 1);

        if (nsnr > 0)
            xmlParserNsPop(ctxt, nsnr);
    }

    ctxt->dict = oldDict;
    ctxt->options = oldOptions;
    ctxt->dictNames = oldDictNames;
    ctxt->loadsubset = oldLoadSubset;
    ctxt->myDoc = NULL;
    ctxt->node = NULL;

exit:
    xmlFreeInputStream(input);
    return(list);
}